

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture_image.h
# Opt level: O2

void __thiscall TextureImage::Texture::clear(Texture *this)

{
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30 [16];
  
  this->available = false;
  local_38 = 0;
  local_30[0] = 0;
  local_40 = local_30;
  std::__cxx11::string::operator=((string *)&this->name,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  local_38 = 0;
  local_30[0] = 0;
  local_40 = local_30;
  std::__cxx11::string::operator=((string *)&this->filename,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  glDeleteTextures(1,&this->tex);
  this->tex = 0;
  return;
}

Assistant:

void clear() {
            available = false;
            name = std::string();
            filename = std::string();
            glDeleteTextures(1, &tex);
            tex = 0;
        }